

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O3

bool __thiscall OpenMD::Globals::addZConsStamp(Globals *this,ZConsStamp *zcons)

{
  pointer *pppZVar1;
  iterator __position;
  ZConsStamp *local_8;
  
  __position._M_current =
       (this->zconstraints_).
       super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->zconstraints_).
      super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = zcons;
    std::vector<OpenMD::ZConsStamp*,std::allocator<OpenMD::ZConsStamp*>>::
    _M_realloc_insert<OpenMD::ZConsStamp*const&>
              ((vector<OpenMD::ZConsStamp*,std::allocator<OpenMD::ZConsStamp*>> *)
               &this->zconstraints_,__position,&local_8);
  }
  else {
    *__position._M_current = zcons;
    pppZVar1 = &(this->zconstraints_).
                super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppZVar1 = *pppZVar1 + 1;
  }
  return true;
}

Assistant:

bool Globals::addZConsStamp(ZConsStamp* zcons) {
    zconstraints_.push_back(zcons);
    return true;
  }